

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTreeClauseVariantIndex::insert
          (SubstitutionTreeClauseVariantIndex *this,Clause *cl)

{
  LeafData ld;
  bool bVar1;
  uint uVar2;
  LiteralSubstitutionTree<Indexing::LiteralClause> **ppLVar3;
  Literal *pLVar4;
  Clause *in_RSI;
  Clause *in_RDI;
  Literal *mainLit;
  ClauseList **plist;
  Literal *lit;
  uint clen;
  LiteralSubstitutionTree<Indexing::LiteralClause> *in_stack_ffffffffffffff98;
  List<Kernel::Clause_*> **in_stack_ffffffffffffffa8;
  LiteralSubstitutionTree<Indexing::LiteralClause> *in_stack_ffffffffffffffb0;
  Literal *in_stack_ffffffffffffffb8;
  DHMap<Kernel::Literal_*,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffd0;
  uint length;
  Literal **in_stack_ffffffffffffffd8;
  SubstitutionTreeClauseVariantIndex *in_stack_ffffffffffffffe0;
  
  length = (uint)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  Kernel::Clause::length(in_RSI);
  uVar2 = Kernel::Clause::length(in_RSI);
  if (uVar2 == 0) {
    Lib::List<Kernel::Clause_*>::push(in_RDI,(List<Kernel::Clause_*> **)in_stack_ffffffffffffff98);
  }
  else {
    uVar2 = Kernel::Clause::length(in_RSI);
    if (uVar2 == 1) {
      Kernel::Clause::operator[](in_RSI,0);
      bVar1 = Kernel::Term::ground((Term *)0x2fe560);
      if (bVar1) {
        Kernel::Clause::operator[](in_RSI,0);
        Lib::
        DHMap<Kernel::Literal_*,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
        ::getValuePtr(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                      (List<Kernel::Clause_*> ***)in_stack_ffffffffffffffb0,
                      in_stack_ffffffffffffffa8);
        Lib::List<Kernel::Clause_*>::push
                  (in_RDI,(List<Kernel::Clause_*> **)in_stack_ffffffffffffff98);
        return;
      }
    }
    ppLVar3 = Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::operator[]
                        ((Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*> *)
                         in_RDI,(size_t)in_stack_ffffffffffffff98);
    if (*ppLVar3 == (LiteralSubstitutionTree<Indexing::LiteralClause> *)0x0) {
      in_stack_ffffffffffffff98 =
           (LiteralSubstitutionTree<Indexing::LiteralClause> *)::operator_new(0x28);
      LiteralSubstitutionTree<Indexing::LiteralClause>::LiteralSubstitutionTree
                (in_stack_ffffffffffffffb0);
      ppLVar3 = Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::operator[]
                          ((Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*> *)
                           in_RDI,(size_t)in_stack_ffffffffffffff98);
      *ppLVar3 = in_stack_ffffffffffffff98;
    }
    Kernel::Clause::literals(in_RSI);
    pLVar4 = getMainLiteral(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,length);
    Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::operator[]
              ((Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*> *)in_RDI,
               (size_t)in_stack_ffffffffffffff98);
    ld.clause = in_RSI;
    ld.literal = pLVar4;
    LiteralIndexingStructure<Indexing::LiteralClause>::insert
              ((LiteralIndexingStructure<Indexing::LiteralClause> *)in_RDI,ld);
  }
  return;
}

Assistant:

void SubstitutionTreeClauseVariantIndex::insert(Clause* cl)
{
  unsigned clen=cl->length();

  if(cl->length()==0) {
    ClauseList::push(cl, _emptyClauses);
    return;
  }
  if(cl->length()==1 && (*cl)[0]->ground()) {
    Literal* lit=(*cl)[0];
    ClauseList** plist;
    _groundUnits.getValuePtr(lit, plist,0);
    ClauseList::push(cl, *plist);
    return;
  }

  if(!_strees[clen]) {
    _strees[clen] = new LiteralSubstitutionTree();
  }
  Literal* mainLit=getMainLiteral(cl->literals(), clen);
  _strees[clen]->insert(LiteralClause{ mainLit, cl });
}